

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superstep.hpp
# Opt level: O3

void __thiscall
Superstep<int>::workerFunction
          (Superstep<int> *this,int index,vector<int,_std::allocator<int>_> *inputItems,
          vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_> *outputItems)

{
  pointer ppVar1;
  int *piVar2;
  vector<int,std::allocator<int>> *this_00;
  iterator __position;
  unique_lock<std::mutex> *puVar3;
  long lVar4;
  unique_lock<std::mutex> *puVar5;
  undefined8 uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  int *piVar10;
  _Self __tmp;
  size_type __new_size;
  _Any_data *p_Var11;
  list<int,_std::allocator<int>_> remainingActivities;
  int i;
  CommunicationProtocols protocols;
  shared_ptr<LockedVector<int>_> targetV;
  unique_lock<std::mutex> local_80;
  ulong local_70;
  int local_64;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_60;
  pointer local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  Superstep<int> *local_38;
  
  Barrier::waitForFinish(&this->startBarrier);
  ppVar1 = (this->activitiesFunctions).
           super__Vector_base<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_60.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = index;
  if (ppVar1[index].first.super__Function_base._M_manager != (_Manager_type)0x0) {
    p_Var11 = (_Any_data *)(ppVar1 + index);
    (**(code **)((long)p_Var11 + 0x18))(p_Var11,(int *)&local_60,inputItems);
    Barrier::decreaseBarrier(&this->compPhaseBarrier);
    ppVar1 = (this->activitiesFunctions).
             super__Vector_base<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_80._M_device = (mutex_type *)CONCAT44(local_80._M_device._4_4_,index);
    if (ppVar1[index].second.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*ppVar1[index].second._M_invoker)
                (&local_60,(_Any_data *)&ppVar1[index].second,(int *)&local_80,inputItems);
      if (local_60.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (pointer)CONCAT44(local_60.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            (int)local_60.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)) {
        local_80._M_device = &this->outputVectorsMutex;
        local_80._M_owns = false;
        std::unique_lock<std::mutex>::lock(&local_80);
        local_80._M_owns = true;
        __new_size = ((long)local_60.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      CONCAT44(local_60.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                               (int)local_60.
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                     -0x5555555555555555;
        lVar4 = (long)(outputItems->
                      super__Vector_base<LockableVector<int>,_std::allocator<LockableVector<int>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(outputItems->
                      super__Vector_base<LockableVector<int>,_std::allocator<LockableVector<int>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 4;
        if ((ulong)(lVar4 * 0x6db6db6db6db6db7) <= __new_size &&
            __new_size + lVar4 * -0x6db6db6db6db6db7 != 0) {
          std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>::resize
                    (outputItems,__new_size);
        }
        std::unique_lock<std::mutex>::~unique_lock(&local_80);
        std::__cxx11::list<int,_std::allocator<int>_>::list
                  ((list<int,_std::allocator<int>_> *)&local_80,
                   ((long)local_60.
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    CONCAT44(local_60.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                             (int)local_60.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                   -0x5555555555555555,(allocator_type *)&stack0xffffffffffffffb8);
        if ((unique_lock<std::mutex> *)local_80._M_device != &local_80) {
          iVar7 = 0;
          puVar5 = (unique_lock<std::mutex> *)local_80._M_device;
          do {
            *(int *)&puVar5[1]._M_device = iVar7;
            iVar7 = iVar7 + 1;
            puVar5 = (unique_lock<std::mutex> *)puVar5->_M_device;
          } while (puVar5 != &local_80);
        }
        LOCK();
        UNLOCK();
        uVar9 = (ulong)(long)(int)nextVectorToLock.super___atomic_base<int>._M_i % local_70;
        uVar8 = local_70;
        nextVectorToLock.super___atomic_base<int>._M_i =
             (__atomic_base<int>)
             (__atomic_base<int>)(nextVectorToLock.super___atomic_base<int>._M_i + 1)._M_i;
        local_38 = this;
        do {
          iVar7 = (int)uVar9;
          lVar4 = (long)iVar7;
          puVar5 = (unique_lock<std::mutex> *)local_80._M_device;
          if (iVar7 < 1) {
            if (iVar7 != 0) {
              do {
                puVar5 = *(unique_lock<std::mutex> **)&puVar5->_M_owns;
                lVar4 = lVar4 + 1;
              } while (lVar4 != 0);
            }
          }
          else {
            do {
              puVar5 = (unique_lock<std::mutex> *)
                       (((_List_base<int,_std::allocator<int>_> *)&puVar5->_M_device)->_M_impl).
                       _M_node.super__List_node_base._M_next;
              lVar4 = lVar4 + -1;
            } while (lVar4 != 0);
          }
          while (puVar5 != &local_80) {
            if (*(long *)(CONCAT44(local_60.
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                   (int)local_60.
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) + 8 +
                         (long)*(int *)&puVar5[1]._M_device * 0x18) ==
                *(long *)(CONCAT44(local_60.
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                   (int)local_60.
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) +
                         (long)*(int *)&puVar5[1]._M_device * 0x18)) {
              puVar3 = (unique_lock<std::mutex> *)puVar5->_M_device;
              local_70 = local_70 - 1;
              std::__detail::_List_node_base::_M_unhook();
              operator_delete(puVar5);
              uVar8 = local_70;
              puVar5 = puVar3;
            }
            else {
              LockableVector<int>::tryLockAndGet((LockableVector<int> *)&stack0xffffffffffffffb8);
              piVar2 = *(int **)(CONCAT44(local_60.
                                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                          (int)local_60.
                                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start) + 8 +
                                (long)*(int *)&puVar5[1]._M_device * 0x18);
              for (piVar10 = *(int **)(CONCAT44(local_60.
                                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                (int)local_60.
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) +
                                      (long)*(int *)&puVar5[1]._M_device * 0x18); piVar10 != piVar2;
                  piVar10 = piVar10 + 1) {
                local_64 = *piVar10;
                this_00 = *(vector<int,std::allocator<int>> **)(local_48 + 2);
                __position._M_current = *(int **)(this_00 + 8);
                if (__position._M_current == *(int **)(this_00 + 0x10)) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int&>
                            (this_00,__position,&local_64);
                }
                else {
                  *__position._M_current = local_64;
                  *(int **)(this_00 + 8) = __position._M_current + 1;
                }
              }
              puVar3 = (unique_lock<std::mutex> *)puVar5->_M_device;
              local_70 = local_70 - 1;
              std::__detail::_List_node_base::_M_unhook();
              operator_delete(puVar5);
              uVar8 = local_70;
              puVar5 = puVar3;
              if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
                uVar8 = local_70;
              }
            }
          }
          uVar9 = 0;
          puVar5 = (unique_lock<std::mutex> *)local_80._M_device;
          this = local_38;
        } while (uVar8 != 0);
        while (local_38 = this, puVar5 != &local_80) {
          puVar3 = (unique_lock<std::mutex> *)puVar5->_M_device;
          operator_delete(puVar5);
          puVar5 = puVar3;
          this = local_38;
        }
      }
      Barrier::decreaseBarrier(&this->commPhaseBarrier);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_60);
      return;
    }
  }
  uVar6 = std::__throw_bad_function_call();
  puVar5 = (unique_lock<std::mutex> *)local_80._M_device;
  while (puVar5 != (unique_lock<std::mutex> *)inputItems) {
    puVar3 = (unique_lock<std::mutex> *)puVar5->_M_device;
    operator_delete(puVar5);
    puVar5 = puVar3;
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_60);
  _Unwind_Resume(uVar6);
}

Assistant:

void Superstep<T>::workerFunction (int index, std::vector<T> &inputItems, std::vector<LockableVector<T>> &outputItems) {
	startBarrier.waitForFinish ();


	
	// ============================
	// Performing computation phase
	activitiesFunctions[index].first (index, inputItems);
	compPhaseBarrier.decreaseBarrier ();



	// ==============================
	// Performing communication phase
	// Computing vector which defines the communication phase
	CommunicationProtocols protocols	= activitiesFunctions[index].second (index, std::ref(inputItems));

	if (protocols.size() != 0) {
		// Checking if a resize of outputvectors is needed
		{
			std::unique_lock<std::mutex> lock (outputVectorsMutex);
			
			if (protocols.size() > outputItems.size()) {
				outputItems.resize (protocols.size ());
			}
		}

		std::list<int> remainingActivities (protocols.size());
		int idx	= 0;
		std::iota (std::begin(remainingActivities), std::end(remainingActivities), idx++);


		int vectorOffset	= (nextVectorToLock++) % remainingActivities.size();
		while (remainingActivities.size() > 0) {
			auto it	= std::begin (remainingActivities);
			std::advance (it, vectorOffset);

			while (it!=remainingActivities.end()) {

				if (protocols[*it].size() == 0) {
					remainingActivities.erase (it++);
				}
				else {
					try {
						std::shared_ptr<LockedVector<T>> targetV	= outputItems[*it].tryLockAndGet();
						auto &targetProtocol						= protocols[*it];
						
						// Inserting data at the end of target vector
						for (auto i : targetProtocol) {
							targetV->data.emplace_back (i);
						}

						remainingActivities.erase (it++);
					} catch (std::logic_error &e) {
						it++;
					}
				}
			}
			vectorOffset	= 0;
		}
	}

	outputItems.shrink_to_fit ();

	commPhaseBarrier.decreaseBarrier ();
}